

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlChar * xmlSplitQName4(xmlChar *name,xmlChar **prefixPtr)

{
  xmlChar *pxVar1;
  xmlChar *pxVar2;
  int len;
  
  if (prefixPtr == (xmlChar **)0x0 || name == (xmlChar *)0x0) {
LAB_001484e9:
    name = (xmlChar *)0x0;
  }
  else {
    *prefixPtr = (xmlChar *)0x0;
    if (*name != ':') {
      len = 0;
      for (pxVar2 = name + 1; pxVar2[-1] != '\0'; pxVar2 = pxVar2 + 1) {
        if (pxVar2[-1] == ':') {
          if (*pxVar2 == '\0') {
            return name;
          }
          pxVar1 = xmlStrndup(name,len);
          if (pxVar1 != (xmlChar *)0x0) {
            *prefixPtr = pxVar1;
            return pxVar2;
          }
          goto LAB_001484e9;
        }
        len = len + 1;
      }
    }
  }
  return name;
}

Assistant:

const xmlChar *
xmlSplitQName4(const xmlChar *name, xmlChar **prefixPtr) {
    xmlChar *prefix;
    int l = 0;

    if ((name == NULL) || (prefixPtr == NULL))
        return(NULL);

    *prefixPtr = NULL;

    /* nasty but valid */
    if (name[0] == ':')
	return(name);

    /*
     * we are not trying to validate but just to cut, and yes it will
     * work even if this is as set of UTF-8 encoded chars
     */
    while ((name[l] != 0) && (name[l] != ':'))
	l++;

    /*
     * TODO: What about names with multiple colons?
     */
    if ((name[l] == 0) || (name[l+1] == 0))
	return(name);

    prefix = xmlStrndup(name, l);
    if (prefix == NULL)
        return(NULL);

    *prefixPtr = prefix;
    return(&name[l+1]);
}